

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICMakeFiles.cxx
# Opt level: O2

Value * cmFileAPICMakeFilesDump
                  (Value *__return_storage_ptr__,cmFileAPI *fileAPI,unsigned_long version)

{
  cmGlobalGenerator *pcVar1;
  pointer ppcVar2;
  string *psVar3;
  bool bVar4;
  bool bVar5;
  string *psVar6;
  Value *pVVar7;
  pointer ppcVar8;
  CMakeFiles cmakeFiles;
  Value local_168;
  Value local_140;
  Value local_118;
  Value local_f0;
  Value local_c8;
  Value local_a0;
  string path;
  Value local_58;
  
  cmakeFiles.FileAPI = fileAPI;
  cmakeFiles.Version = version;
  psVar6 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  std::operator+(&cmakeFiles.CMakeModules,psVar6,"/Modules");
  cmakeFiles.TopSource = cmake::GetHomeDirectory_abi_cxx11_((cmakeFiles.FileAPI)->CMakeInstance);
  cmakeFiles.TopBuild =
       cmake::GetHomeOutputDirectory_abi_cxx11_((cmakeFiles.FileAPI)->CMakeInstance);
  cmakeFiles.OutOfSource = std::operator!=(cmakeFiles.TopBuild,cmakeFiles.TopSource);
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_168,objectValue);
  Json::Value::Value(&local_118,cmakeFiles.TopSource);
  pVVar7 = Json::Value::operator[](&local_168,"source");
  Json::Value::operator=(pVVar7,&local_118);
  Json::Value::~Value(&local_118);
  Json::Value::Value(&local_140,cmakeFiles.TopBuild);
  pVVar7 = Json::Value::operator[](&local_168,"build");
  Json::Value::operator=(pVVar7,&local_140);
  Json::Value::~Value(&local_140);
  pVVar7 = Json::Value::operator[](__return_storage_ptr__,"paths");
  Json::Value::operator=(pVVar7,&local_168);
  Json::Value::~Value(&local_168);
  Json::Value::Value(&local_f0,arrayValue);
  pcVar1 = (cmakeFiles.FileAPI)->CMakeInstance->GlobalGenerator;
  ppcVar2 = (pcVar1->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar8 = (pcVar1->LocalGenerators).
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppcVar8 != ppcVar2; ppcVar8 = ppcVar8 + 1) {
    psVar3 = ((*ppcVar8)->Makefile->ListFiles).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar6 = ((*ppcVar8)->Makefile->ListFiles).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar3; psVar6 = psVar6 + 1)
    {
      Json::Value::Value(&local_c8,objectValue);
      bVar4 = cmsys::SystemTools::IsSubDirectory(psVar6,&cmakeFiles.CMakeModules);
      if (bVar4) {
        Json::Value::Value(&local_118,true);
        pVVar7 = Json::Value::operator[](&local_c8,"isCMake");
        Json::Value::operator=(pVVar7,&local_118);
        Json::Value::~Value(&local_118);
      }
      bVar5 = cmsys::SystemTools::IsSubDirectory(psVar6,cmakeFiles.TopSource);
      if (!bVar5) {
        bVar5 = cmsys::SystemTools::IsSubDirectory(psVar6,cmakeFiles.TopBuild);
        if (!bVar5) {
          Json::Value::Value(&local_140,true);
          pVVar7 = Json::Value::operator[](&local_c8,"isExternal");
          Json::Value::operator=(pVVar7,&local_140);
          Json::Value::~Value(&local_140);
        }
      }
      if (cmakeFiles.OutOfSource == true) {
        bVar5 = cmsys::SystemTools::IsSubDirectory(psVar6,cmakeFiles.TopBuild);
        if (bVar5) {
          Json::Value::Value(&local_a0,true);
          pVVar7 = Json::Value::operator[](&local_c8,"isGenerated");
          Json::Value::operator=(pVVar7,&local_a0);
          Json::Value::~Value(&local_a0);
        }
      }
      std::__cxx11::string::string((string *)&path,(string *)psVar6);
      if (!bVar4) {
        bVar4 = cmsys::SystemTools::IsSubDirectory(&path,cmakeFiles.TopSource);
        if (bVar4) {
          cmSystemTools::RelativePath((string *)&local_58,cmakeFiles.TopSource,&path);
          std::__cxx11::string::operator=((string *)&path,(string *)&local_58);
          std::__cxx11::string::~string((string *)&local_58);
        }
      }
      Json::Value::Value(&local_58,&path);
      pVVar7 = Json::Value::operator[](&local_c8,"path");
      Json::Value::operator=(pVVar7,&local_58);
      Json::Value::~Value(&local_58);
      std::__cxx11::string::~string((string *)&path);
      Json::Value::append(&local_f0,&local_c8);
      Json::Value::~Value(&local_c8);
    }
  }
  pVVar7 = Json::Value::operator[](__return_storage_ptr__,"inputs");
  Json::Value::operator=(pVVar7,&local_f0);
  Json::Value::~Value(&local_f0);
  std::__cxx11::string::~string((string *)&cmakeFiles.CMakeModules);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPICMakeFilesDump(cmFileAPI& fileAPI, unsigned long version)
{
  CMakeFiles cmakeFiles(fileAPI, version);
  return cmakeFiles.Dump();
}